

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O3

CLBool * __thiscall CLBool::operator=(CLBool *this,string *other)

{
  stringstream sstream;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::operator<<(local_188,(string *)other);
  std::istream::operator>>((istream *)asStack_198,(bool *)(this + 0x50));
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return this;
}

Assistant:

CLBool& operator=(std::string& other) {
        std::stringstream sstream ;
        sstream << other ;
        sstream >> value ;
        return *this ;
    }